

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinGetCos(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Int_t *vLeaves,Vec_Int_t *vRoots)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int i;
  
  vRoots->nSize = 0;
  if (vLeaves != (Vec_Int_t *)0x0) {
    for (i = 0; i < vLeaves->nSize; i = i + 1) {
      iVar1 = Vec_IntEntry(vLeaves,i);
      pAVar2 = Aig_ManObj(pAig,iVar1);
      iVar1 = Saig_ObjIsLo(pAig,pAVar2);
      if (iVar1 != 0) {
        pAVar2 = Saig_ObjLoToLi(pAig,pAVar2);
        Vec_IntPush(vRoots,pAVar2->Id);
      }
    }
    return;
  }
  pAVar2 = Aig_ManCo(pAig,pCex->iPo);
  Vec_IntPush(vRoots,pAVar2->Id);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the roots to begin traversal.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManCexMinGetCos( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Int_t * vLeaves, Vec_Int_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vRoots );
    if ( vLeaves == NULL )
    {
        pObj = Aig_ManCo( pAig, pCex->iPo );
        Vec_IntPush( vRoots, Aig_ObjId(pObj) );
        return;
    }
    Aig_ManForEachObjVec( vLeaves, pAig, pObj, i )
        if ( Saig_ObjIsLo(pAig, pObj) )
            Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
}